

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCase::
verify<tcu::TextureCubeView,tcu::Vector<float,3>>
          (TextureGatherCase *this,ConstPixelBufferAccess *rendered,TextureCubeView *texture,
          Vector<float,_3> (*texCoords) [4],GatherArgs *gatherArgs)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  float width;
  TextureFormat TVar3;
  long lVar4;
  PixelOffsets *pPVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  int iVar9;
  string *psVar10;
  ConstPixelBufferAccess *pCVar11;
  Surface *pSVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int iVar13;
  ChannelOrder CVar14;
  float z;
  void *data;
  undefined8 data_00;
  int px;
  ChannelOrder CVar15;
  ChannelOrder CVar16;
  float y;
  int px_2;
  int iVar17;
  int iVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar29;
  uint uVar30;
  uint uVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Vector<float,_3> VVar32;
  Vector<bool,_4> res_1;
  Vector<float,_3> texCoord_2;
  Vector<float,_3> texCoord;
  Surface errorMask_1;
  Surface ideal;
  Surface errorMask;
  Vec4 resultPix;
  TextureLevel ideal_1;
  Vec4 idealPix;
  PixelBufferAccess idealAccess;
  IVec2 offsets [4];
  Vec4 refColor;
  IVec4 colorBits;
  undefined1 local_478 [8];
  TextureFormat TStack_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  float local_44c;
  TextureFormat local_448;
  undefined1 local_440 [8];
  TextureFormat local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  ConstPixelBufferAccess *local_420;
  undefined1 local_418 [8];
  TextureFormat TStack_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [2];
  undefined8 local_3e8;
  void *local_3e0;
  void *local_3d8;
  string local_3d0;
  Sampler *local_3b0;
  string local_3a8;
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  TextureFormat TStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Alloc_hider local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [6];
  float local_2e8;
  ChannelType CStack_2e4;
  ChannelOrder CStack_2e0;
  ChannelType CStack_2dc;
  TextureLevel local_2d8;
  Vector<float,_3> (*local_2b0) [4];
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [2];
  undefined1 local_278 [24];
  TextureFormat local_260;
  undefined8 uStack_258;
  BVec4 local_250;
  float fStack_24c;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  local_248;
  undefined1 local_238 [8];
  TestContext *pTStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [4];
  ios_base local_1c0 [264];
  Sampler local_b8;
  IVec4 local_78 [4];
  
  local_2b0 = texCoords;
  TVar3 = *(TextureFormat *)(*(long *)(this + 8) + 0x10);
  local_3b0 = (Sampler *)texture;
  if (((byte)this[0xb4] & 1) != 0) {
    uVar8 = 0;
    if (0 < gatherArgs->componentNdx) {
      uVar8 = (ulong)(uint)gatherArgs->componentNdx;
    }
    local_378._0_4_ = R;
    local_378._4_4_ = SNORM_INT8;
    TStack_370 = (TextureFormat)0x3f80000000000000;
    local_b8.wrapT = *(WrapMode *)(local_378 + uVar8 * 4);
    local_388 = ZEXT416(local_b8.wrapT);
    local_b8.wrapS = local_b8.wrapT;
    local_b8.minFilter = local_b8.wrapT;
    local_b8.wrapR = local_b8.wrapT;
    bVar7 = Functional::anon_unknown_0::verifySingleColored
                      ((TestLog *)TVar3,rendered,(Vec4 *)&local_b8);
    if (bVar7) {
      return bVar7;
    }
    local_238 = (undefined1  [8])TVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_230);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pTStack_230,"Note: expected color ",0x15);
    tcu::operator<<((ostream *)&pTStack_230,(Vector<float,_4> *)&local_b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pTStack_230," for all pixels; ",0x11);
    std::ostream::_M_insert<double>((double)(float)local_388._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pTStack_230," is component at index ",0x17);
    std::ostream::operator<<((ostringstream *)&pTStack_230,(int)uVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_230," in the color ",0xe)
    ;
    tcu::operator<<((ostream *)&pTStack_230,(Vector<float,_4> *)local_378);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pTStack_230,", which is used for incomplete textures",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_230);
    std::ios_base::~ios_base(local_1c0);
    return bVar7;
  }
  uVar29 = *(uint *)(this + 0x78);
  local_448 = TVar3;
  local_420 = rendered;
  Functional::anon_unknown_0::TextureGatherCase::getOffsetRange((TextureGatherCase *)local_238);
  Functional::anon_unknown_0::makePixelOffsetsFunctor
            (&local_248,(anon_unknown_0 *)(ulong)uVar29,(GatherType)gatherArgs,
             (GatherArgs *)((ulong)local_238 & 0xffffffff),(IVec2 *)((ulong)local_238 >> 0x20));
  pPVar5 = local_248.
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
           .m_data.ptr;
  local_78[0].m_data[0] = 7;
  local_78[0].m_data[1] = 7;
  local_78[0].m_data[2] = 7;
  local_78[0].m_data[3] = 7;
  uVar8 = (ulong)*(uint *)(this + 0xb8);
  CVar15 = ~R;
  iVar17 = -1;
  iVar13 = -1;
  iVar18 = -1;
  if (uVar8 < 3) {
    CVar15 = *(ChannelOrder *)(&DAT_01c7f4a0 + uVar8 * 4);
    iVar17 = *(uint *)(this + 0xb8) * 10;
    iVar13 = *(int *)(&DAT_01c7f4ac + uVar8 * 4);
    iVar18 = *(int *)(&DAT_01c7f4b8 + uVar8 * 4);
  }
  local_b8.wrapR = WRAPMODE_LAST;
  local_b8.minFilter = FILTERMODE_LAST;
  local_b8.magFilter = FILTERMODE_LAST;
  local_b8.lodThreshold = 0.0;
  local_b8.normalizedCoords = true;
  local_b8.depthStencilMode = MODE_DEPTH;
  local_b8._32_8_ = 0;
  local_b8.borderColor.v._4_5_ = 0;
  local_b8.borderColor.v.uData[2]._1_3_ = 0;
  local_b8._48_5_ = 0;
  local_b8._0_8_ = *(undefined8 *)(this + 0x8c);
  local_b8.compare = *(CompareMode *)(this + 0x88);
  if ((*(int *)(this + 0x80) == 0x14) || (*(int *)(this + 0x80) == 0x12)) {
    local_2d8.m_format.type = CVar15;
    local_2d8.m_format.order = CVar15;
    local_2d8.m_size.m_data[1] = iVar13;
    local_2d8.m_size.m_data[0] = iVar17;
    local_2d8.m_data.m_ptr = (void *)0x1000000010;
    local_2d8._20_4_ = iVar18;
    local_2d8.m_size.m_data[2] = iVar13;
    local_2d8.m_data.m_cap._0_4_ = 7;
    local_3e8 = &PTR_operator___02165428;
    local_3e0 = (void *)0x4000000040;
    CVar15 = (local_420->m_size).m_data[0];
    tcu::Surface::Surface((Surface *)&local_3d0,CVar15,CVar15);
    local_238._0_4_ = RGBA;
    local_238._4_4_ = UNORM_INT8;
    data = (void *)CONCAT26(local_3d0.field_2._M_allocated_capacity._6_2_,
                            local_3d0.field_2._M_allocated_capacity._0_6_);
    if ((void *)CONCAT26(local_3d0.field_2._M_allocated_capacity._6_2_,
                         local_3d0.field_2._M_allocated_capacity._0_6_) != (void *)0x0) {
      data = (void *)local_3d0._M_string_length;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_278,(TextureFormat *)local_238,
               (int)local_3d0._M_dataplus._M_p,local_3d0._M_dataplus._M_p._4_4_,1,data);
    tcu::Surface::Surface((Surface *)&local_3a8,CVar15,CVar15);
    local_378._0_4_ = RGBA;
    local_378._4_4_ = UNORM_INT8;
    data_00 = local_3a8.field_2._M_allocated_capacity;
    if ((void *)local_3a8.field_2._M_allocated_capacity != (void *)0x0) {
      data_00 = local_3a8._M_string_length;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_238,(TextureFormat *)local_378,
               (int)local_3a8._M_dataplus._M_p,local_3a8._M_dataplus._M_p._4_4_,1,(void *)data_00);
    local_2a8._0_4_ = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)local_2a8);
    tcu::clear((PixelBufferAccess *)local_238,(Vec4 *)local_378);
    if ((int)CVar15 < 1) {
      bVar7 = true;
    }
    else {
      local_2e8 = (float)(int)CVar15;
      bVar7 = true;
      CVar14 = R;
      do {
        local_44c = ((float)(int)CVar14 + 0.5) / local_2e8;
        CVar16 = R;
        do {
          local_228._M_allocated_capacity = 0;
          local_228._8_8_ = 0;
          local_238._0_4_ = R;
          local_238._4_4_ = SNORM_INT8;
          pTStack_230 = (TestContext *)0x0;
          local_378._4_4_ = CVar14;
          local_378._0_4_ = CVar16;
          (**pPVar5->_vptr_PixelOffsets)(pPVar5,(ConstPixelBufferAccess *)local_378,local_238);
          auVar26 = (undefined1  [12])0x0;
          VVar32 = triQuadInterpolate<tcu::Vector<float,3>>
                             ((_anonymous_namespace_ *)local_418,local_2b0,
                              ((float)(int)CVar16 + 0.5) / local_2e8,local_44c);
          auVar24._0_4_ = VVar32.m_data[2];
          auVar24._4_12_ = auVar26;
          uVar19 = (*(code *)*local_3e8)
                             (VVar32.m_data._0_8_,auVar24._0_8_,&local_3e8,
                              (ConstPixelBufferAccess *)local_378);
          local_388._0_4_ = uVar19;
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_378,(int)local_420,CVar16,CVar14);
          tcu::TextureCubeView::gatherCompare
                    ((TextureCubeView *)local_2a8,local_3b0,(float)local_388._0_4_,
                     (float)local_418._0_4_,(float)local_418._4_4_,(float)TStack_410.order);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_278,(Vec4 *)local_2a8,CVar16,CVar14,0);
          auVar20._4_4_ = -(uint)((float)local_2a8._4_4_ == (float)local_378._4_4_);
          auVar20._0_4_ = -(uint)((float)local_2a8._0_4_ == (float)local_378._0_4_);
          auVar20._8_4_ = -(uint)((float)uStack_2a0 == (float)TStack_370.order);
          auVar20._12_4_ = -(uint)(uStack_2a0._4_4_ == (float)TStack_370.type);
          auVar20 = packssdw(auVar20,auVar20);
          auVar20 = packsswb(auVar20,auVar20);
          local_478._0_4_ = SUB164(auVar20 & _DAT_01b805f0,0);
          if (SUB161(auVar20 & _DAT_01b805f0,0) == '\0') {
LAB_01629d73:
            bVar6 = tcu::isGatherCompareResultValid
                              ((TextureCubeView *)local_3b0,&local_b8,
                               (TexComparePrecision *)&local_2d8,(Vec3 *)local_418,
                               (float)local_388._0_4_,(Vec4 *)local_378);
            if (!bVar6) {
              *(undefined4 *)
               (local_3a8._M_string_length +
               (long)(int)((int)local_3a8._M_dataplus._M_p * CVar14 + CVar16) * 4) = 0xff0000ff;
              bVar7 = false;
            }
          }
          else {
            uVar8 = 0xffffffffffffffff;
            do {
              if (uVar8 == 2) goto LAB_01629dcb;
              uVar1 = uVar8 + 1;
              lVar4 = uVar8 + 2;
              uVar8 = uVar1;
            } while (local_478[lVar4] != '\0');
            if (uVar1 < 3) goto LAB_01629d73;
          }
LAB_01629dcb:
          CVar16 = CVar16 + A;
        } while (CVar16 != CVar15);
        CVar14 = CVar14 + A;
      } while (CVar14 != CVar15);
    }
    local_298[0]._M_allocated_capacity = (ConstPixelBufferAccess *)0x6552796669726556;
    local_298[0]._8_4_ = 0x746c7573;
    uStack_2a0 = (ConstPixelBufferAccess *)0xc;
    local_298[0]._M_local_buf[0xc] = '\0';
    local_418 = (undefined1  [8])local_408;
    local_238._0_4_ = S;
    local_238._4_4_ = SNORM_INT8;
    local_2a8 = (undefined1  [8])local_298;
    local_418 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_418,(ulong)local_238);
    local_408[0]._M_allocated_capacity = local_238;
    *(undefined8 *)local_418 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_418 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_418 + 0xf),"sult",4);
    TStack_410.order = local_238._0_4_;
    TStack_410.type = local_238._4_4_;
    *(char *)((long)local_418 + (long)local_238) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_378,(string *)local_2a8,(string *)local_418);
    TVar3 = local_448;
    tcu::TestLog::startImageSet((TestLog *)local_448,(char *)local_378,local_358._M_p);
    local_468._M_allocated_capacity._0_4_ = 0x646e6552;
    local_468._M_allocated_capacity._4_4_ = 0x64657265;
    TStack_470.order = RGBA;
    TStack_470.type = SNORM_INT8;
    local_468._8_2_ = (ushort)(byte)local_468._M_local_buf[9] << 8;
    local_430._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_430._M_allocated_capacity._6_2_ = 0x6465;
    local_430._M_local_buf[8] = ' ';
    local_430._M_local_buf[9] = 'i';
    local_430._10_4_ = 0x6567616d;
    local_438.order = sRGB;
    local_438.type = SNORM_INT8;
    local_430._M_local_buf[0xe] = '\0';
    pCVar11 = local_420;
    local_478 = (undefined1  [8])&local_468;
    local_440 = (undefined1  [8])&local_430;
    tcu::LogImage::LogImage
              ((LogImage *)local_238,(string *)local_478,(string *)local_440,local_420,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_238,TVar3.order,__buf,(size_t)pCVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_allocated_capacity != local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      (ulong)(local_208[0]._M_allocated_capacity + 1));
    }
    if (local_238 != (undefined1  [8])&local_228) {
      operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
    }
    if (local_440 != (undefined1  [8])&local_430) {
      operator_delete((void *)local_440,
                      CONCAT26(local_430._M_allocated_capacity._6_2_,
                               local_430._M_allocated_capacity._0_6_) + 1);
    }
    if (local_478 != (undefined1  [8])&local_468) {
      operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_p != local_348) {
      operator_delete(local_358._M_p,(ulong)(local_348[0]._M_allocated_capacity + 1));
    }
    if (local_378 != (undefined1  [8])&local_368) {
      operator_delete((void *)local_378,(ulong)(local_368._M_allocated_capacity + 1));
    }
    if (local_418 != (undefined1  [8])local_408) {
      operator_delete((void *)local_418,local_408[0]._M_allocated_capacity + 1);
    }
    if (local_2a8 != (undefined1  [8])local_298) {
      operator_delete((void *)local_2a8,(ulong)(local_298[0]._M_allocated_capacity + 1));
    }
    if (!bVar7) {
      local_298[0]._M_allocated_capacity = (ConstPixelBufferAccess *)0x636e657265666552;
      local_298[0]._8_2_ = 0x65;
      uStack_2a0 = (ConstPixelBufferAccess *)0x9;
      local_418 = (undefined1  [8])local_408;
      local_378._0_4_ = CHANNELORDER_LAST;
      local_378._4_4_ = SNORM_INT8;
      local_2a8 = (undefined1  [8])local_298;
      local_418 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_418,(ulong)local_378);
      local_408[0]._M_allocated_capacity = local_378;
      *(undefined8 *)local_418 = 0x6572206c61656449;
      builtin_strncpy((char *)((long)local_418 + 8),"ference ",8);
      builtin_strncpy((char *)((long)local_418 + 0xd),"ce image",8);
      TStack_410.order = local_378._0_4_;
      TStack_410.type = local_378._4_4_;
      *(char *)((long)local_418 + (long)local_378) = '\0';
      psVar10 = &local_3d0;
      tcu::LogImage::LogImage
                ((LogImage *)local_238,(string *)local_2a8,(string *)local_418,(Surface *)psVar10,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_238,local_448.order,__buf_00,(size_t)psVar10);
      local_468._M_allocated_capacity._0_4_ = 0x6f727245;
      local_468._M_allocated_capacity._4_4_ = 0x73614d72;
      local_468._8_2_ = 0x6b;
      TStack_470.order = ARGB;
      TStack_470.type = SNORM_INT8;
      local_430._M_allocated_capacity._0_6_ = 0x20726f727245;
      local_430._M_allocated_capacity._6_2_ = 0x616d;
      local_430._M_local_buf[8] = 's';
      local_430._M_local_buf[9] = 'k';
      local_438.order = BGR;
      local_438.type = SNORM_INT8;
      local_430._10_4_ = local_430._10_4_ & 0xffffff00;
      psVar10 = &local_3a8;
      local_478 = (undefined1  [8])&local_468;
      local_440 = (undefined1  [8])&local_430;
      tcu::LogImage::LogImage
                ((LogImage *)local_378,(string *)local_478,(string *)local_440,(Surface *)psVar10,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_378,local_448.order,__buf_01,(size_t)psVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_p != local_348) {
        operator_delete(local_358._M_p,(ulong)(local_348[0]._M_allocated_capacity + 1));
      }
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,(ulong)(local_368._M_allocated_capacity + 1));
      }
      if (local_440 != (undefined1  [8])&local_430) {
        operator_delete((void *)local_440,
                        CONCAT26(local_430._M_allocated_capacity._6_2_,
                                 local_430._M_allocated_capacity._0_6_) + 1);
      }
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_allocated_capacity != local_208) {
        operator_delete((void *)local_218._M_allocated_capacity,
                        (ulong)(local_208[0]._M_allocated_capacity + 1));
      }
      if (local_238 != (undefined1  [8])&local_228) {
        operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
      }
      if (local_418 != (undefined1  [8])local_408) {
        operator_delete((void *)local_418,local_408[0]._M_allocated_capacity + 1);
      }
      if (local_2a8 != (undefined1  [8])local_298) {
        operator_delete((void *)local_2a8,(ulong)(local_298[0]._M_allocated_capacity + 1));
      }
    }
    tcu::TestLog::endImageSet((TestLog *)local_448);
    tcu::Surface::~Surface((Surface *)&local_3a8);
    tcu::Surface::~Surface((Surface *)&local_3d0);
    goto LAB_0162b3f4;
  }
  iVar9 = 0;
  if (0 < gatherArgs->componentNdx) {
    iVar9 = gatherArgs->componentNdx;
  }
  local_388._0_4_ = iVar9;
  uVar29 = *(uint *)(this + 0x84);
  uVar8 = (ulong)uVar29;
  if (uVar8 < 0x22) {
    if ((0x58UL >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x2c0000000U >> (uVar8 & 0x3f) & 1) == 0) goto LAB_0162af3e;
      goto LAB_01629f63;
    }
    local_278._0_4_ = DS|I;
    local_278._4_4_ = UNSIGNED_INT_11F_11F_10F_REV;
    local_278._8_4_ = 0x16;
    local_278._12_4_ = 0x10;
    local_278._16_4_ = 0x10;
    local_278._20_4_ = 0x10;
    local_260.order = R;
    local_260.type = SNORM_INT8;
    uStack_258 = (TestContext *)0x0;
    local_250.m_data[0] = true;
    local_250.m_data[1] = true;
    local_250.m_data[2] = true;
    local_250.m_data[3] = true;
    tcu::computeFixedPointThreshold((tcu *)local_238,local_78);
    pPVar5 = local_248.
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
             .m_data.ptr;
    local_260.order = local_238._0_4_;
    local_260.type = local_238._4_4_;
    uStack_258 = pTStack_230;
    local_278._4_4_ = CVar15;
    local_278._0_4_ = CVar15;
    local_278._12_4_ = iVar13;
    local_278._8_4_ = iVar17;
    local_278._20_4_ = iVar18;
    local_278._16_4_ = iVar13;
    local_250.m_data[0] = true;
    local_250.m_data[1] = true;
    local_250.m_data[2] = true;
    local_250.m_data[3] = true;
    CVar15 = (local_420->m_size).m_data[0];
    tcu::TextureLevel::TextureLevel(&local_2d8,&local_420->m_format,CVar15,CVar15,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a8,&local_2d8);
    tcu::Surface::Surface((Surface *)&local_3e8,CVar15,CVar15);
    local_378._0_4_ = RGBA;
    local_378._4_4_ = UNORM_INT8;
    if (local_3d8 != (void *)0x0) {
      local_3d8 = local_3e0;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_238,(TextureFormat *)local_378,(int)local_3e8,
               local_3e8._4_4_,1,local_3d8);
    local_418._0_4_ = -1.7146522e+38;
    tcu::RGBA::toVec((RGBA *)local_418);
    tcu::clear((PixelBufferAccess *)local_238,(Vec4 *)local_378);
    if ((int)CVar15 < 1) {
      bVar7 = true;
    }
    else {
      local_2e8 = (float)(int)CVar15;
      bVar7 = true;
      CVar14 = R;
      do {
        local_44c = ((float)(int)CVar14 + 0.5) / local_2e8;
        CVar16 = R;
        do {
          local_228._M_allocated_capacity = 0;
          local_228._8_8_ = 0;
          local_238._0_4_ = R;
          local_238._4_4_ = SNORM_INT8;
          pTStack_230 = (TestContext *)0x0;
          local_378._4_4_ = CVar14;
          local_378._0_4_ = CVar16;
          (**pPVar5->_vptr_PixelOffsets)(pPVar5,(TextureCubeView *)local_378,local_238);
          triQuadInterpolate<tcu::Vector<float,3>>
                    ((_anonymous_namespace_ *)local_440,local_2b0,
                     ((float)(int)CVar16 + 0.5) / local_2e8,local_44c);
          tcu::ConstPixelBufferAccess::getPixelT<float>
                    ((ConstPixelBufferAccess *)local_418,(int)local_420,CVar16,CVar14);
          tcu::TextureCubeView::gather
                    ((TextureCubeView *)local_378,local_3b0,(float)local_440._0_4_,
                     (float)local_440._4_4_,(float)local_438.order,(int)&local_b8);
          local_478 = local_378;
          TStack_470 = TStack_370;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_2a8,(Vec4 *)local_478,CVar16,CVar14,0);
          auVar22._4_4_ =
               -(uint)((float)local_260.type <
                      (float)(~-(uint)((float)local_478._4_4_ < (float)local_418._4_4_) &
                              (uint)((float)local_478._4_4_ - (float)local_418._4_4_) |
                             (uint)((float)local_418._4_4_ - (float)local_478._4_4_) &
                             -(uint)((float)local_478._4_4_ < (float)local_418._4_4_)));
          auVar22._0_4_ =
               -(uint)((float)local_260.order <
                      (float)(~-(uint)((float)local_478._0_4_ < (float)local_418._0_4_) &
                              (uint)((float)local_478._0_4_ - (float)local_418._0_4_) |
                             (uint)((float)local_418._0_4_ - (float)local_478._0_4_) &
                             -(uint)((float)local_478._0_4_ < (float)local_418._0_4_)));
          auVar22._8_4_ =
               -(uint)((float)uStack_258 <
                      (float)(~-(uint)((float)TStack_470.order < (float)TStack_410.order) &
                              (uint)((float)TStack_470.order - (float)TStack_410.order) |
                             (uint)((float)TStack_410.order - (float)TStack_470.order) &
                             -(uint)((float)TStack_470.order < (float)TStack_410.order)));
          auVar22._12_4_ =
               -(uint)(uStack_258._4_4_ <
                      (float)(~-(uint)((float)TStack_470.type < (float)TStack_410.type) &
                              (uint)((float)TStack_470.type - (float)TStack_410.type) |
                             (uint)((float)TStack_410.type - (float)TStack_470.type) &
                             -(uint)((float)TStack_470.type < (float)TStack_410.type)));
          auVar20 = packssdw(auVar22,auVar22);
          auVar20 = packsswb(auVar20,auVar20);
          auVar25._4_4_ = fStack_24c;
          auVar25[0] = local_250.m_data[0];
          auVar25[1] = local_250.m_data[1];
          auVar25[2] = local_250.m_data[2];
          auVar25[3] = local_250.m_data[3];
          auVar25._8_8_ = 0;
          auVar20 = auVar25 & auVar20 & _DAT_01b805f0;
          uVar29 = auVar20._0_4_;
          if (((auVar20[0] != '\0') || ((uVar29 >> 8 & 1) != 0)) ||
             (((uVar29 >> 0x10 & 1) != 0 || ((uVar29 >> 0x18 & 1) != 0)))) {
            bVar6 = tcu::isGatherResultValid
                              ((TextureCubeView *)local_3b0,&local_b8,(LookupPrecision *)local_278,
                               (Vec3 *)local_440,local_388._0_4_,(Vec4 *)local_418);
            if (!bVar6) {
              *(undefined4 *)((long)local_3e0 + (long)(int)((int)local_3e8 * CVar14 + CVar16) * 4) =
                   0xff0000ff;
              bVar7 = false;
            }
          }
          CVar16 = CVar16 + A;
        } while (CVar15 != CVar16);
        CVar14 = CVar14 + A;
      } while (CVar14 != CVar15);
    }
    local_408[0]._0_4_ = 0x69726556;
    local_408[0]._4_4_ = 0x65527966;
    local_408[0]._8_4_ = 0x746c7573;
    TStack_410.order = sR;
    TStack_410.type = SNORM_INT8;
    local_408[0]._M_local_buf[0xc] = '\0';
    local_478 = (undefined1  [8])&local_468;
    local_238._0_4_ = S;
    local_238._4_4_ = SNORM_INT8;
    local_418 = (undefined1  [8])local_408;
    local_478 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_478,(ulong)local_238);
    local_468._M_allocated_capacity = (size_type)local_238;
    *(undefined8 *)local_478 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_478 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_478 + 0xf),"sult",4);
    TStack_470.order = local_238._0_4_;
    TStack_470.type = local_238._4_4_;
    *(char *)((long)local_478 + (long)local_238) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_378,(string *)local_418,(string *)local_478);
    TVar3 = local_448;
    tcu::TestLog::startImageSet((TestLog *)local_448,(char *)local_378,local_358._M_p);
    local_430._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_430._M_allocated_capacity._6_2_ = 0x6465;
    local_438.order = RGBA;
    local_438.type = SNORM_INT8;
    local_430._M_local_buf[8] = '\0';
    paVar2 = &local_3d0.field_2;
    local_3d0.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_3d0.field_2._M_allocated_capacity._6_2_ = 0x6465;
    local_3d0.field_2._8_2_ = 0x6920;
    local_3d0.field_2._10_4_ = 0x6567616d;
    local_3d0._M_string_length = 0xe;
    local_3d0.field_2._M_local_buf[0xe] = '\0';
    pCVar11 = local_420;
    local_440 = (undefined1  [8])&local_430;
    local_3d0._M_dataplus._M_p = (pointer)paVar2;
    tcu::LogImage::LogImage
              ((LogImage *)local_238,(string *)local_440,&local_3d0,local_420,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_238,TVar3.order,__buf_02,(size_t)pCVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_allocated_capacity != local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      (ulong)(local_208[0]._M_allocated_capacity + 1));
    }
    if (local_238 != (undefined1  [8])&local_228) {
      operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3d0._M_dataplus._M_p,
                      CONCAT26(local_3d0.field_2._M_allocated_capacity._6_2_,
                               local_3d0.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if (local_440 != (undefined1  [8])&local_430) {
      operator_delete((void *)local_440,
                      CONCAT26(local_430._M_allocated_capacity._6_2_,
                               local_430._M_allocated_capacity._0_6_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_p != local_348) {
      operator_delete(local_358._M_p,(ulong)(local_348[0]._M_allocated_capacity + 1));
    }
    if (local_378 != (undefined1  [8])&local_368) {
      operator_delete((void *)local_378,(ulong)(local_368._M_allocated_capacity + 1));
    }
    if (local_478 != (undefined1  [8])&local_468) {
      operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
    }
    if (local_418 != (undefined1  [8])local_408) {
      operator_delete((void *)local_418,local_408[0]._M_allocated_capacity + 1);
    }
    if (!bVar7) {
      local_478 = (undefined1  [8])&local_468;
      local_468._M_allocated_capacity._0_4_ = 0x65666552;
      local_468._M_allocated_capacity._4_4_ = 0x636e6572;
      local_468._8_2_ = 0x65;
      TStack_470.order = ARGB;
      TStack_470.type = SNORM_INT8;
      local_378._0_4_ = CHANNELORDER_LAST;
      local_378._4_4_ = SNORM_INT8;
      local_440 = (undefined1  [8])&local_430;
      local_440 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_440,(ulong)local_378);
      local_430._M_allocated_capacity._0_6_ = local_378._0_6_;
      local_430._M_allocated_capacity._6_2_ = local_378._6_2_;
      *(undefined8 *)local_440 = 0x6572206c61656449;
      *(char *)((long)local_440 + 8) = 'f';
      *(char *)((long)local_440 + 9) = 'e';
      *(char *)((long)local_440 + 10) = 'r';
      *(char *)((long)local_440 + 0xb) = 'e';
      *(char *)((long)local_440 + 0xc) = 'n';
      *(char *)((long)local_440 + 0xd) = 'c';
      *(char *)((long)local_440 + 0xe) = 'e';
      *(char *)((long)local_440 + 0xf) = ' ';
      *(char *)((long)local_440 + 0xd) = 'c';
      *(char *)((long)local_440 + 0xe) = 'e';
      *(char *)((long)local_440 + 0xf) = ' ';
      *(char *)((long)local_440 + 0x10) = 'i';
      *(char *)((long)local_440 + 0x11) = 'm';
      *(char *)((long)local_440 + 0x12) = 'a';
      *(char *)((long)local_440 + 0x13) = 'g';
      *(char *)((long)local_440 + 0x14) = 'e';
      local_438.order = local_378._0_4_;
      local_438.type = local_378._4_4_;
      *(char *)((long)local_440 + (long)local_378) = '\0';
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_418,&local_2d8);
      pCVar11 = (ConstPixelBufferAccess *)local_418;
      tcu::LogImage::LogImage
                ((LogImage *)local_238,(string *)local_478,(string *)local_440,pCVar11,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_238,local_448.order,__buf_03,(size_t)pCVar11);
      local_3d0.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
      local_3d0.field_2._M_allocated_capacity._6_2_ = 0x7361;
      local_3d0.field_2._8_2_ = 0x6b;
      local_3d0._M_string_length = 9;
      local_3a8.field_2._M_allocated_capacity = 0x616d20726f727245;
      local_3a8.field_2._8_2_ = 0x6b73;
      local_3a8._M_string_length = 10;
      local_3a8.field_2._M_local_buf[10] = '\0';
      pSVar12 = (Surface *)&local_3e8;
      local_3d0._M_dataplus._M_p = (pointer)paVar2;
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      tcu::LogImage::LogImage
                ((LogImage *)local_378,&local_3d0,&local_3a8,pSVar12,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_378,local_448.order,__buf_04,(size_t)pSVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_p != local_348) {
        operator_delete(local_358._M_p,(ulong)(local_348[0]._M_allocated_capacity + 1));
      }
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,(ulong)(local_368._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3d0._M_dataplus._M_p,
                        CONCAT26(local_3d0.field_2._M_allocated_capacity._6_2_,
                                 local_3d0.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_allocated_capacity != local_208) {
        operator_delete((void *)local_218._M_allocated_capacity,
                        (ulong)(local_208[0]._M_allocated_capacity + 1));
      }
      if (local_238 != (undefined1  [8])&local_228) {
        operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
      }
      if (local_440 != (undefined1  [8])&local_430) {
        operator_delete((void *)local_440,
                        CONCAT26(local_430._M_allocated_capacity._6_2_,
                                 local_430._M_allocated_capacity._0_6_) + 1);
      }
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
      }
    }
    tcu::TestLog::endImageSet((TestLog *)local_448);
  }
  else {
LAB_0162af3e:
    if (2 < uVar29 - 0x1b) {
LAB_0162b6f8:
      bVar7 = false;
      goto LAB_0162b3f4;
    }
LAB_01629f63:
    local_260.order = R;
    local_260.type = SNORM_INT8;
    uStack_258 = (TestContext *)0x0;
    local_278._4_4_ = CVar15;
    local_278._0_4_ = CVar15;
    local_278._12_4_ = iVar13;
    local_278._8_4_ = iVar17;
    local_278._20_4_ = iVar18;
    local_278._16_4_ = iVar13;
    local_250.m_data[0] = true;
    local_250.m_data[1] = true;
    local_250.m_data[2] = true;
    local_250.m_data[3] = true;
    if ((uVar29 < 0x22) && ((0x2c0000000U >> ((ulong)uVar29 & 0x3f) & 1) != 0)) {
      width = (float)(local_420->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel(&local_2d8,&local_420->m_format,(int)width,(int)width,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a8,&local_2d8);
      tcu::Surface::Surface((Surface *)&local_3e8,(int)width,(int)width);
      local_378._0_4_ = RGBA;
      local_378._4_4_ = UNORM_INT8;
      if (local_3d8 != (void *)0x0) {
        local_3d8 = local_3e0;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_238,(TextureFormat *)local_378,(int)local_3e8,
                 local_3e8._4_4_,1,local_3d8);
      local_418._0_4_ = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)local_418);
      tcu::clear((PixelBufferAccess *)local_238,(Vec4 *)local_378);
      if ((int)width < 1) {
        bVar7 = true;
      }
      else {
        local_44c = (float)(int)width;
        bVar7 = true;
        z = 0.0;
        do {
          fStack_24c = ((float)(int)z + 0.5) / local_44c;
          y = 0.0;
          do {
            local_228._M_allocated_capacity = 0;
            local_228._8_8_ = 0;
            local_238._0_4_ = R;
            local_238._4_4_ = SNORM_INT8;
            pTStack_230 = (TestContext *)0x0;
            local_378._0_4_ = y;
            local_378._4_4_ = z;
            (**pPVar5->_vptr_PixelOffsets)(pPVar5,(TextureCubeView *)local_378,local_238);
            triQuadInterpolate<tcu::Vector<float,3>>
                      ((_anonymous_namespace_ *)local_478,local_2b0,
                       ((float)(int)y + 0.5) / local_44c,fStack_24c);
            tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                      ((ConstPixelBufferAccess *)local_418,(int)local_420,(int)y,(int)z);
            tcu::TextureCubeView::gather
                      ((TextureCubeView *)local_378,local_3b0,(float)local_478._0_4_,
                       (float)local_478._4_4_,(float)TStack_470.order,(int)&local_b8);
            local_2e8 = (float)((int)((float)local_378._0_4_ - 2.1474836e+09) &
                                (int)(float)local_378._0_4_ >> 0x1f | (int)(float)local_378._0_4_);
            CStack_2e4 = (int)((float)local_378._4_4_ - 2.1474836e+09) &
                         (int)(float)local_378._4_4_ >> 0x1f | (int)(float)local_378._4_4_;
            CStack_2e0 = (int)((float)TStack_370.order - 2.1474836e+09) &
                         (int)(float)TStack_370.order >> 0x1f | (int)(float)TStack_370.order;
            CStack_2dc = (int)((float)TStack_370.type - 2.1474836e+09) &
                         (int)(float)TStack_370.type >> 0x1f | (int)(float)TStack_370.type;
            local_378._4_4_ = CStack_2e4;
            local_378._0_4_ = local_2e8;
            TStack_370.type = CStack_2dc;
            TStack_370.order = CStack_2e0;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_2a8,(IVec4 *)local_378,(int)y,(int)z,0);
            uVar29 = -(uint)((int)(CStack_2e4 ^ 0x80000000) < (int)-(float)local_418._4_4_);
            uVar30 = -(uint)((int)(CStack_2e0 ^ 0x80000000) < (int)-(float)TStack_410.order);
            uVar31 = -(uint)((int)(CStack_2dc ^ 0x80000000) < (int)-(float)TStack_410.type);
            auVar27._0_4_ =
                 -(uint)((int)-(float)local_260.order <
                        (int)(-(uint)((int)-local_2e8 < (int)-(float)local_418._0_4_) -
                              (local_418._0_4_ - (int)local_2e8 ^
                              -(uint)((int)-local_2e8 < (int)-(float)local_418._0_4_)) ^ 0x80000000)
                        );
            auVar27._4_4_ =
                 -(uint)((int)-(float)local_260.type <
                        (int)(uVar29 - (local_418._4_4_ - CStack_2e4 ^ uVar29) ^ 0x80000000));
            auVar27._8_4_ =
                 -(uint)((int)-(float)uStack_258 <
                        (int)(uVar30 - (TStack_410.order - CStack_2e0 ^ uVar30) ^ 0x80000000));
            auVar27._12_4_ =
                 -(uint)((int)-uStack_258._4_4_ <
                        (int)(uVar31 - (TStack_410.type - CStack_2dc ^ uVar31) ^ 0x80000000));
            auVar20 = packssdw(auVar27,auVar27);
            auVar20 = packsswb(auVar20,auVar20);
            auVar21._4_4_ = fStack_24c;
            auVar21[0] = local_250.m_data[0];
            auVar21[1] = local_250.m_data[1];
            auVar21[2] = local_250.m_data[2];
            auVar21[3] = local_250.m_data[3];
            auVar21._8_8_ = 0;
            auVar20 = auVar21 & auVar20 & _DAT_01b805f0;
            uVar29 = auVar20._0_4_;
            if (((auVar20[0] != '\0') || ((uVar29 >> 8 & 1) != 0)) ||
               (((uVar29 >> 0x10 & 1) != 0 || ((uVar29 >> 0x18 & 1) != 0)))) {
              bVar6 = tcu::isGatherResultValid
                                ((TextureCubeView *)local_3b0,&local_b8,
                                 (IntLookupPrecision *)local_278,(Vec3 *)local_478,local_388._0_4_,
                                 (UVec4 *)local_418);
              if (!bVar6) {
                *(undefined4 *)((long)local_3e0 + (long)((int)local_3e8 * (int)z + (int)y) * 4) =
                     0xff0000ff;
                bVar7 = false;
              }
            }
            y = (float)((int)y + 1);
          } while (width != y);
          z = (float)((int)z + 1);
        } while (z != width);
      }
      local_408[0]._0_4_ = 0x69726556;
      local_408[0]._4_4_ = 0x65527966;
      local_408[0]._8_4_ = 0x746c7573;
      TStack_410.order = sR;
      TStack_410.type = SNORM_INT8;
      local_408[0]._M_local_buf[0xc] = '\0';
      local_478 = (undefined1  [8])&local_468;
      local_238._0_4_ = S;
      local_238._4_4_ = SNORM_INT8;
      local_418 = (undefined1  [8])local_408;
      local_478 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_478,(ulong)local_238);
      local_468._M_allocated_capacity = (size_type)local_238;
      *(undefined8 *)local_478 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_478 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_478 + 0xf),"sult",4);
      TStack_470.order = local_238._0_4_;
      TStack_470.type = local_238._4_4_;
      *(char *)((long)local_478 + (long)local_238) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_378,(string *)local_418,(string *)local_478);
      TVar3 = local_448;
      tcu::TestLog::startImageSet((TestLog *)local_448,(char *)local_378,local_358._M_p);
      local_430._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_430._M_allocated_capacity._6_2_ = 0x6465;
      local_438.order = RGBA;
      local_438.type = SNORM_INT8;
      local_430._M_local_buf[8] = '\0';
      paVar2 = &local_3d0.field_2;
      local_3d0.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_3d0.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_3d0.field_2._8_2_ = 0x6920;
      local_3d0.field_2._10_4_ = 0x6567616d;
      local_3d0._M_string_length = 0xe;
      local_3d0.field_2._M_local_buf[0xe] = '\0';
      pCVar11 = local_420;
      local_440 = (undefined1  [8])&local_430;
      local_3d0._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogImage::LogImage
                ((LogImage *)local_238,(string *)local_440,&local_3d0,local_420,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_238,TVar3.order,__buf_05,(size_t)pCVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_allocated_capacity != local_208) {
        operator_delete((void *)local_218._M_allocated_capacity,
                        (ulong)(local_208[0]._M_allocated_capacity + 1));
      }
      if (local_238 != (undefined1  [8])&local_228) {
        operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3d0._M_dataplus._M_p,
                        CONCAT26(local_3d0.field_2._M_allocated_capacity._6_2_,
                                 local_3d0.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_440 != (undefined1  [8])&local_430) {
        operator_delete((void *)local_440,
                        CONCAT26(local_430._M_allocated_capacity._6_2_,
                                 local_430._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_p != local_348) {
        operator_delete(local_358._M_p,(ulong)(local_348[0]._M_allocated_capacity + 1));
      }
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,(ulong)(local_368._M_allocated_capacity + 1));
      }
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
      }
      if (local_418 != (undefined1  [8])local_408) {
        operator_delete((void *)local_418,local_408[0]._M_allocated_capacity + 1);
      }
      if (!bVar7) {
        local_478 = (undefined1  [8])&local_468;
        local_468._M_allocated_capacity._0_4_ = 0x65666552;
        local_468._M_allocated_capacity._4_4_ = 0x636e6572;
        local_468._8_2_ = 0x65;
        TStack_470.order = ARGB;
        TStack_470.type = SNORM_INT8;
        local_378._0_4_ = CHANNELORDER_LAST;
        local_378._4_4_ = SNORM_INT8;
        local_440 = (undefined1  [8])&local_430;
        local_440 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_440,(ulong)local_378);
        local_430._M_allocated_capacity._0_6_ = local_378._0_6_;
        local_430._M_allocated_capacity._6_2_ = local_378._6_2_;
        *(undefined8 *)local_440 = 0x6572206c61656449;
        *(char *)((long)local_440 + 8) = 'f';
        *(char *)((long)local_440 + 9) = 'e';
        *(char *)((long)local_440 + 10) = 'r';
        *(char *)((long)local_440 + 0xb) = 'e';
        *(char *)((long)local_440 + 0xc) = 'n';
        *(char *)((long)local_440 + 0xd) = 'c';
        *(char *)((long)local_440 + 0xe) = 'e';
        *(char *)((long)local_440 + 0xf) = ' ';
        *(char *)((long)local_440 + 0xd) = 'c';
        *(char *)((long)local_440 + 0xe) = 'e';
        *(char *)((long)local_440 + 0xf) = ' ';
        *(char *)((long)local_440 + 0x10) = 'i';
        *(char *)((long)local_440 + 0x11) = 'm';
        *(char *)((long)local_440 + 0x12) = 'a';
        *(char *)((long)local_440 + 0x13) = 'g';
        *(char *)((long)local_440 + 0x14) = 'e';
        local_438.order = local_378._0_4_;
        local_438.type = local_378._4_4_;
        *(char *)((long)local_440 + (long)local_378) = '\0';
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_418,&local_2d8);
        pCVar11 = (ConstPixelBufferAccess *)local_418;
        tcu::LogImage::LogImage
                  ((LogImage *)local_238,(string *)local_478,(string *)local_440,pCVar11,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_238,local_448.order,__buf_06,(size_t)pCVar11);
        local_3d0.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_3d0.field_2._M_allocated_capacity._6_2_ = 0x7361;
        local_3d0.field_2._8_2_ = 0x6b;
        local_3d0._M_string_length = 9;
        local_3a8.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_3a8.field_2._8_2_ = 0x6b73;
        local_3a8._M_string_length = 10;
        local_3a8.field_2._M_local_buf[10] = '\0';
        pSVar12 = (Surface *)&local_3e8;
        local_3d0._M_dataplus._M_p = (pointer)paVar2;
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        tcu::LogImage::LogImage
                  ((LogImage *)local_378,&local_3d0,&local_3a8,pSVar12,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_378,local_448.order,__buf_07,(size_t)pSVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_p != local_348) {
          operator_delete(local_358._M_p,(ulong)(local_348[0]._M_allocated_capacity + 1));
        }
        if (local_378 != (undefined1  [8])&local_368) {
          operator_delete((void *)local_378,(ulong)(local_368._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d0._M_dataplus._M_p,
                          CONCAT26(local_3d0.field_2._M_allocated_capacity._6_2_,
                                   local_3d0.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_allocated_capacity != local_208) {
          operator_delete((void *)local_218._M_allocated_capacity,
                          (ulong)(local_208[0]._M_allocated_capacity + 1));
        }
        if (local_238 != (undefined1  [8])&local_228) {
          operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
        }
        if (local_440 != (undefined1  [8])&local_430) {
          operator_delete((void *)local_440,
                          CONCAT26(local_430._M_allocated_capacity._6_2_,
                                   local_430._M_allocated_capacity._0_6_) + 1);
        }
        if (local_478 != (undefined1  [8])&local_468) {
          operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet((TestLog *)local_448);
    }
    else {
      if (2 < uVar29 - 0x1b) goto LAB_0162b6f8;
      CVar15 = (local_420->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel(&local_2d8,&local_420->m_format,CVar15,CVar15,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a8,&local_2d8);
      tcu::Surface::Surface((Surface *)&local_3e8,CVar15,CVar15);
      local_378._0_4_ = RGBA;
      local_378._4_4_ = UNORM_INT8;
      if (local_3d8 != (void *)0x0) {
        local_3d8 = local_3e0;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_238,(TextureFormat *)local_378,(int)local_3e8,
                 local_3e8._4_4_,1,local_3d8);
      local_418._0_4_ = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)local_418);
      tcu::clear((PixelBufferAccess *)local_238,(Vec4 *)local_378);
      if ((int)CVar15 < 1) {
        bVar7 = true;
      }
      else {
        local_2e8 = (float)(int)CVar15;
        bVar7 = true;
        CVar14 = R;
        do {
          local_44c = ((float)(int)CVar14 + 0.5) / local_2e8;
          CVar16 = R;
          do {
            local_228._M_allocated_capacity = 0;
            local_228._8_8_ = 0;
            local_238._0_4_ = R;
            local_238._4_4_ = SNORM_INT8;
            pTStack_230 = (TestContext *)0x0;
            local_378._4_4_ = CVar14;
            local_378._0_4_ = CVar16;
            (**pPVar5->_vptr_PixelOffsets)(pPVar5,(TextureCubeView *)local_378,local_238);
            triQuadInterpolate<tcu::Vector<float,3>>
                      ((_anonymous_namespace_ *)local_440,local_2b0,
                       ((float)(int)CVar16 + 0.5) / local_2e8,local_44c);
            tcu::ConstPixelBufferAccess::getPixelT<int>
                      ((ConstPixelBufferAccess *)local_418,(int)local_420,CVar16,CVar14);
            tcu::TextureCubeView::gather
                      ((TextureCubeView *)local_378,local_3b0,(float)local_440._0_4_,
                       (float)local_440._4_4_,(float)local_438.order,(int)&local_b8);
            local_478._4_4_ = (int)(float)local_378._4_4_;
            local_478._0_4_ = (int)(float)local_378._0_4_;
            TStack_470.type = (int)(float)TStack_370.type;
            TStack_470.order = (int)(float)TStack_370.order;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_2a8,(IVec4 *)local_478,CVar16,CVar14,0);
            auVar28._0_4_ =
                 -(uint)((int)local_260.order <
                        (int)(-(uint)((int)local_478._0_4_ < (int)local_418._0_4_) -
                             (local_418._0_4_ - local_478._0_4_ ^
                             -(uint)((int)local_478._0_4_ < (int)local_418._0_4_))));
            auVar28._4_4_ =
                 -(uint)((int)local_260.type <
                        (int)(-(uint)((int)local_478._4_4_ < (int)local_418._4_4_) -
                             (local_418._4_4_ - local_478._4_4_ ^
                             -(uint)((int)local_478._4_4_ < (int)local_418._4_4_))));
            auVar28._8_4_ =
                 -(uint)((int)(float)uStack_258 <
                        (int)(-(uint)((int)TStack_470.order < (int)TStack_410.order) -
                             (TStack_410.order - TStack_470.order ^
                             -(uint)((int)TStack_470.order < (int)TStack_410.order))));
            auVar28._12_4_ =
                 -(uint)((int)uStack_258._4_4_ <
                        (int)(-(uint)((int)TStack_470.type < (int)TStack_410.type) -
                             (TStack_410.type - TStack_470.type ^
                             -(uint)((int)TStack_470.type < (int)TStack_410.type))));
            auVar20 = packssdw(auVar28,auVar28);
            auVar20 = packsswb(auVar20,auVar20);
            auVar23._4_4_ = fStack_24c;
            auVar23[0] = local_250.m_data[0];
            auVar23[1] = local_250.m_data[1];
            auVar23[2] = local_250.m_data[2];
            auVar23[3] = local_250.m_data[3];
            auVar23._8_8_ = 0;
            auVar20 = auVar23 & auVar20 & _DAT_01b805f0;
            uVar29 = auVar20._0_4_;
            if ((((auVar20[0] != '\0') || ((uVar29 >> 8 & 1) != 0)) || ((uVar29 >> 0x10 & 1) != 0))
               || ((uVar29 >> 0x18 & 1) != 0)) {
              bVar6 = tcu::isGatherResultValid
                                ((TextureCubeView *)local_3b0,&local_b8,
                                 (IntLookupPrecision *)local_278,(Vec3 *)local_440,local_388._0_4_,
                                 (IVec4 *)local_418);
              if (!bVar6) {
                *(undefined4 *)((long)local_3e0 + (long)(int)((int)local_3e8 * CVar14 + CVar16) * 4)
                     = 0xff0000ff;
                bVar7 = false;
              }
            }
            CVar16 = CVar16 + A;
          } while (CVar15 != CVar16);
          CVar14 = CVar14 + A;
        } while (CVar14 != CVar15);
      }
      local_408[0]._0_4_ = 0x69726556;
      local_408[0]._4_4_ = 0x65527966;
      local_408[0]._8_4_ = 0x746c7573;
      TStack_410.order = sR;
      TStack_410.type = SNORM_INT8;
      local_408[0]._M_local_buf[0xc] = '\0';
      local_478 = (undefined1  [8])&local_468;
      local_238._0_4_ = S;
      local_238._4_4_ = SNORM_INT8;
      local_418 = (undefined1  [8])local_408;
      local_478 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_478,(ulong)local_238);
      local_468._M_allocated_capacity = (size_type)local_238;
      *(undefined8 *)local_478 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_478 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_478 + 0xf),"sult",4);
      TStack_470.order = local_238._0_4_;
      TStack_470.type = local_238._4_4_;
      *(char *)((long)local_478 + (long)local_238) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_378,(string *)local_418,(string *)local_478);
      TVar3 = local_448;
      tcu::TestLog::startImageSet((TestLog *)local_448,(char *)local_378,local_358._M_p);
      local_430._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_430._M_allocated_capacity._6_2_ = 0x6465;
      local_438.order = RGBA;
      local_438.type = SNORM_INT8;
      local_430._M_local_buf[8] = '\0';
      paVar2 = &local_3d0.field_2;
      local_3d0.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_3d0.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_3d0.field_2._8_2_ = 0x6920;
      local_3d0.field_2._10_4_ = 0x6567616d;
      local_3d0._M_string_length = 0xe;
      local_3d0.field_2._M_local_buf[0xe] = '\0';
      pCVar11 = local_420;
      local_440 = (undefined1  [8])&local_430;
      local_3d0._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogImage::LogImage
                ((LogImage *)local_238,(string *)local_440,&local_3d0,local_420,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_238,TVar3.order,__buf_08,(size_t)pCVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_allocated_capacity != local_208) {
        operator_delete((void *)local_218._M_allocated_capacity,
                        (ulong)(local_208[0]._M_allocated_capacity + 1));
      }
      if (local_238 != (undefined1  [8])&local_228) {
        operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3d0._M_dataplus._M_p,
                        CONCAT26(local_3d0.field_2._M_allocated_capacity._6_2_,
                                 local_3d0.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_440 != (undefined1  [8])&local_430) {
        operator_delete((void *)local_440,
                        CONCAT26(local_430._M_allocated_capacity._6_2_,
                                 local_430._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_p != local_348) {
        operator_delete(local_358._M_p,(ulong)(local_348[0]._M_allocated_capacity + 1));
      }
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,(ulong)(local_368._M_allocated_capacity + 1));
      }
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
      }
      if (local_418 != (undefined1  [8])local_408) {
        operator_delete((void *)local_418,local_408[0]._M_allocated_capacity + 1);
      }
      if (!bVar7) {
        local_478 = (undefined1  [8])&local_468;
        local_468._M_allocated_capacity._0_4_ = 0x65666552;
        local_468._M_allocated_capacity._4_4_ = 0x636e6572;
        local_468._8_2_ = 0x65;
        TStack_470.order = ARGB;
        TStack_470.type = SNORM_INT8;
        local_440 = (undefined1  [8])&local_430;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_440,"Ideal reference image","");
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_418,&local_2d8);
        pCVar11 = (ConstPixelBufferAccess *)local_418;
        tcu::LogImage::LogImage
                  ((LogImage *)local_238,(string *)local_478,(string *)local_440,pCVar11,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_238,local_448.order,__buf_09,(size_t)pCVar11);
        local_3d0.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_3d0.field_2._M_allocated_capacity._6_2_ = 0x7361;
        local_3d0.field_2._8_2_ = 0x6b;
        local_3d0._M_string_length = 9;
        local_3a8.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_3a8.field_2._8_2_ = 0x6b73;
        local_3a8._M_string_length = 10;
        local_3a8.field_2._M_local_buf[10] = '\0';
        pSVar12 = (Surface *)&local_3e8;
        local_3d0._M_dataplus._M_p = (pointer)paVar2;
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        tcu::LogImage::LogImage
                  ((LogImage *)local_378,&local_3d0,&local_3a8,pSVar12,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_378,local_448.order,__buf_10,(size_t)pSVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_p != local_348) {
          operator_delete(local_358._M_p,(ulong)(local_348[0]._M_allocated_capacity + 1));
        }
        if (local_378 != (undefined1  [8])&local_368) {
          operator_delete((void *)local_378,(ulong)(local_368._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d0._M_dataplus._M_p,
                          CONCAT26(local_3d0.field_2._M_allocated_capacity._6_2_,
                                   local_3d0.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_allocated_capacity != local_208) {
          operator_delete((void *)local_218._M_allocated_capacity,
                          (ulong)(local_208[0]._M_allocated_capacity + 1));
        }
        if (local_238 != (undefined1  [8])&local_228) {
          operator_delete((void *)local_238,(ulong)(local_228._M_allocated_capacity + 1));
        }
        if (local_440 != (undefined1  [8])&local_430) {
          operator_delete((void *)local_440,
                          CONCAT26(local_430._M_allocated_capacity._6_2_,
                                   local_430._M_allocated_capacity._0_6_) + 1);
        }
        if (local_478 != (undefined1  [8])&local_468) {
          operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet((TestLog *)local_448);
    }
  }
  tcu::Surface::~Surface((Surface *)&local_3e8);
  tcu::TextureLevel::~TextureLevel(&local_2d8);
LAB_0162b3f4:
  if (local_248.
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
      .m_data.ptr != (PixelOffsets *)0x0) {
    (*(local_248.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
       .m_data.ptr)->_vptr_PixelOffsets[2])();
  }
  return bVar7;
}

Assistant:

bool TextureGatherCase::verify (const ConstPixelBufferAccess&	rendered,
								const TexViewT&					texture,
								const TexCoordT					(&texCoords)[4],
								const GatherArgs&				gatherArgs) const
{
	TestLog& log = m_testCtx.getLog();

	if (m_flags & GATHERCASE_MIPMAP_INCOMPLETE)
	{
		const int	componentNdx		= de::max(0, gatherArgs.componentNdx);
		const Vec4	incompleteColor		(0.0f, 0.0f, 0.0f, 1.0f);
		const Vec4	refColor			(incompleteColor[componentNdx]);
		const bool	isOk				= verifySingleColored(log, rendered, refColor);

		if (!isOk)
			log << TestLog::Message << "Note: expected color " << refColor << " for all pixels; "
									<< incompleteColor[componentNdx] << " is component at index " << componentNdx
									<< " in the color " << incompleteColor << ", which is used for incomplete textures" << TestLog::EndMessage;

		return isOk;
	}
	else
	{
		DE_ASSERT(m_colorBufferFormat.order == tcu::TextureFormat::RGBA);
		DE_ASSERT(m_colorBufferFormat.type == tcu::TextureFormat::UNORM_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT8);

		const MovePtr<PixelOffsets>		pixelOffsets	= makePixelOffsetsFunctor(m_gatherType, gatherArgs, getOffsetRange());
		const tcu::PixelFormat			pixelFormat		= tcu::PixelFormat(8,8,8,8);
		const IVec4						colorBits		= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - 1, tcu::IVec4(0));
		const IVec3						coordBits		= m_textureType == TEXTURETYPE_2D			? IVec3(20,20,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(10,10,10)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(20,20,20)
														: IVec3(-1);
		const IVec3						uvwBits			= m_textureType == TEXTURETYPE_2D			? IVec3(7,7,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(6,6,0)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(7,7,7)
														: IVec3(-1);
		tcu::Sampler					sampler;
		sampler.wrapS		= m_wrapS;
		sampler.wrapT		= m_wrapT;
		sampler.compare		= m_shadowCompareMode;

		if (isDepthFormat(m_textureFormat))
		{
			tcu::TexComparePrecision comparePrec;
			comparePrec.coordBits		= coordBits;
			comparePrec.uvwBits			= uvwBits;
			comparePrec.referenceBits	= 16;
			comparePrec.resultBits		= pixelFormat.redBits-1;

			return verifyGatherOffsetsCompare(log, rendered, texture, texCoords, sampler, comparePrec, PixelCompareRefZDefault(RENDER_SIZE), *pixelOffsets);
		}
		else
		{
			const int componentNdx = de::max(0, gatherArgs.componentNdx);

			if (isUnormFormatType(m_textureFormat.type))
			{
				tcu::LookupPrecision lookupPrec;
				lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(colorBits);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);
				return verifyGatherOffsets<float>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
			}
			else if (isUIntFormatType(m_textureFormat.type) || isSIntFormatType(m_textureFormat.type))
			{
				tcu::IntLookupPrecision		lookupPrec;
				lookupPrec.colorThreshold	= UVec4(0);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

				if (isUIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deUint32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else if (isSIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deInt32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else
				{
					DE_ASSERT(false);
					return false;
				}
			}
			else
			{
				DE_ASSERT(false);
				return false;
			}
		}
	}
}